

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
complex_policy::escape<kiste::serializer_impl::serializer<html,complex_policy,ratio_policy>,double>
          (complex_policy *this,serializer<html,_complex_policy,_ratio_policy> *serializer,
          complex<double> *value)

{
  std::ostream::_M_insert<double>(*(double *)value->_M_value);
  kiste::html::escape<char[4],_nullptr>((html *)serializer,(char (*) [4])" + ");
  std::ostream::_M_insert<double>(*(double *)(value->_M_value + 8));
  kiste::html::escape<char[5],_nullptr>((html *)serializer,(char (*) [5])" * i");
  return;
}

Assistant:

void escape(SerializerT& serializer, const std::complex<T>& value)
  {
    serializer.escape(value.real());
    serializer.escape(" + ");
    serializer.escape(value.imag());
    serializer.escape(" * i");
  }